

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiftMotor.h
# Opt level: O0

void __thiscall LiftMotor::LiftMotor(LiftMotor *this,ofstream *myFile)

{
  int iVar1;
  time_t tVar2;
  ostream *poVar3;
  ostream *in_RSI;
  int *in_RDI;
  
  in_RDI[2] = 0;
  in_RDI[3] = 10000;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"LIFT MOTOR INITIALIZED!");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = (ostream *)std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"LIFT MOTOR INITIALIZED!");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  iVar1 = rand();
  *in_RDI = iVar1 % in_RDI[3];
  *(undefined1 *)((long)in_RDI + 5) = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  return;
}

Assistant:

LiftMotor::LiftMotor(ofstream &myFile)
{
	srand(time(NULL));
	cout << endl << "LIFT MOTOR INITIALIZED!" << endl;
	myFile << endl << "LIFT MOTOR INITIALIZED!" << endl;
	z = rand() % zmax;
	LimitSwitchTop = false;
	LimitSwitchBottom = false;
}